

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_esni_dispose_context(ptls_esni_context_t *esni)

{
  code *pcVar1;
  long lVar2;
  long *in_RDI;
  ptls_iovec_t pVar3;
  size_t i;
  uint8_t *local_20;
  size_t local_18;
  long local_10;
  
  if (*in_RDI != 0) {
    for (local_10 = 0; *(long *)(*in_RDI + local_10 * 8) != 0; local_10 = local_10 + 1) {
      pcVar1 = *(code **)(*(long *)(*in_RDI + local_10 * 8) + 0x18);
      lVar2 = *in_RDI;
      pVar3 = ptls_iovec_init((void *)0x0,0);
      local_20 = pVar3.base;
      local_18 = pVar3.len;
      (*pcVar1)(lVar2 + local_10 * 8,1,0,local_20,local_18);
    }
    free((void *)*in_RDI);
  }
  free((void *)in_RDI[1]);
  return;
}

Assistant:

void ptls_esni_dispose_context(ptls_esni_context_t *esni)
{
    size_t i;

    if (esni->key_exchanges != NULL) {
        for (i = 0; esni->key_exchanges[i] != NULL; ++i)
            esni->key_exchanges[i]->on_exchange(esni->key_exchanges + i, 1, NULL, ptls_iovec_init(NULL, 0));
        free(esni->key_exchanges);
    }
    free(esni->cipher_suites);
}